

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paex_ocean_shore.c
# Opt level: O0

float GeneratePinkNoise(PinkNoise *pink)

{
  unsigned_long uVar1;
  uint local_2c;
  int local_28;
  int n;
  int numZeros;
  float output;
  long sum;
  long newRandom;
  PinkNoise *pink_local;
  
  pink->pink_Index = pink->pink_Index + 1U & pink->pink_IndexMask;
  if (pink->pink_Index != 0) {
    local_28 = 0;
    for (local_2c = pink->pink_Index; (local_2c & 1) == 0; local_2c = (int)local_2c >> 1) {
      local_28 = local_28 + 1;
    }
    pink->pink_RunningSum = pink->pink_RunningSum - pink->pink_Rows[local_28];
    uVar1 = GenerateRandomNumber();
    pink->pink_RunningSum = ((long)uVar1 >> 0x28) + pink->pink_RunningSum;
    pink->pink_Rows[local_28] = (long)uVar1 >> 0x28;
  }
  uVar1 = GenerateRandomNumber();
  return pink->pink_Scalar * (float)(pink->pink_RunningSum + ((long)uVar1 >> 0x28));
}

Assistant:

float GeneratePinkNoise( PinkNoise *pink )
{
    long newRandom;
    long sum;
    float output;
    /* Increment and mask index. */
    pink->pink_Index = (pink->pink_Index + 1) & pink->pink_IndexMask;
    /* If index is zero, don't update any random values. */
    if( pink->pink_Index != 0 )
    {
        /* Determine how many trailing zeros in PinkIndex. */
        /* This algorithm will hang if n==0 so test first. */
        int numZeros = 0;
        int n = pink->pink_Index;
        while( (n & 1) == 0 )
        {
            n = n >> 1;
            numZeros++;
        }
        /* Replace the indexed ROWS random value.
         * Subtract and add back to RunningSum instead of adding all the random
         * values together. Only one changes each time.
         */
        pink->pink_RunningSum -= pink->pink_Rows[numZeros];
        newRandom = ((long)GenerateRandomNumber()) >> PINK_RANDOM_SHIFT;
        pink->pink_RunningSum += newRandom;
        pink->pink_Rows[numZeros] = newRandom;
    }

    /* Add extra white noise value. */
    newRandom = ((long)GenerateRandomNumber()) >> PINK_RANDOM_SHIFT;
    sum = pink->pink_RunningSum + newRandom;
    /* Scale to range of -1.0 to 0.9999. */
    output = pink->pink_Scalar * sum;
    return output;
}